

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::copyUniformData
               (UniformLayout *dstLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *dstBlockPointers,UniformLayout *srcLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *srcBlockPointers)

{
  _Rep_type *p_Var1;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *pmVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  pointer ppVar6;
  char *pcVar7;
  reference piVar8;
  const_reference srcEntry_00;
  const_reference dstEntry;
  void *local_98;
  int dstUniformNdx;
  UniformLayoutEntry *srcEntry;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_iterator srcUniformNdxIter;
  void *dstBlockPtr;
  const_iterator cStack_48;
  int dstBlockNdx;
  void *local_40;
  void *srcBlockPtr;
  BlockLayoutEntry *srcBlock;
  int srcBlockNdx;
  int numBlocks;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *srcBlockPointers_local;
  UniformLayout *srcLayout_local;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *dstBlockPointers_local;
  UniformLayout *dstLayout_local;
  
  _srcBlockNdx = srcBlockPointers;
  srcBlockPointers_local =
       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)srcLayout
  ;
  srcLayout_local = (UniformLayout *)dstBlockPointers;
  dstBlockPointers_local =
       (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)dstLayout
  ;
  sVar5 = std::
          vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
          ::size(&srcLayout->blocks);
  srcBlock._4_4_ = (int)sVar5;
  for (srcBlock._0_4_ = 0; (int)srcBlock < srcBlock._4_4_; srcBlock._0_4_ = (int)srcBlock + 1) {
    srcBlockPtr = std::
                  vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                *)srcBlockPointers_local,(long)(int)srcBlock);
    cStack_48 = std::
                map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                find(_srcBlockNdx,(key_type_conflict *)&srcBlock);
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->
                       (&stack0xffffffffffffffb8);
    pmVar2 = dstBlockPointers_local;
    local_40 = ppVar6->second;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    dstBlockPtr._4_4_ = UniformLayout::getBlockIndex((UniformLayout *)pmVar2,pcVar7);
    if (dstBlockPtr._4_4_ < 0) {
      local_98 = (void *)0x0;
    }
    else {
      srcUniformNdxIter._M_current =
           (int *)std::
                  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                  find((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                        *)srcLayout_local,(key_type_conflict *)((long)&dstBlockPtr + 4));
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_int,_void_*>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_void_*>_> *)
                          &srcUniformNdxIter);
      local_98 = ppVar6->second;
    }
    if (-1 < dstBlockPtr._4_4_) {
      local_68._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)((long)srcBlockPtr + 0x28));
      while( true ) {
        srcEntry = (UniformLayoutEntry *)
                   std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)((long)srcBlockPtr + 0x28));
        bVar3 = __gnu_cxx::operator!=
                          (&local_68,
                           (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            *)&srcEntry);
        if (!bVar3) break;
        p_Var1 = &srcBlockPointers_local->_M_t;
        piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_68);
        srcEntry_00 = std::
                      vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                      ::operator[]((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                    *)&(p_Var1->_M_impl).super__Rb_tree_header._M_header._M_left,
                                   (long)*piVar8);
        pmVar2 = dstBlockPointers_local;
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar4 = UniformLayout::getUniformIndex((UniformLayout *)pmVar2,pcVar7);
        if (-1 < iVar4) {
          dstEntry = std::
                     vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ::operator[]((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                   *)&(dstBlockPointers_local->_M_t)._M_impl.super__Rb_tree_header.
                                      _M_header._M_left,(long)iVar4);
          copyUniformData(dstEntry,local_98,srcEntry_00,local_40);
        }
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_68,0);
      }
    }
  }
  return;
}

Assistant:

void copyUniformData (const UniformLayout& dstLayout, const std::map<int, void*>& dstBlockPointers, const UniformLayout& srcLayout, const std::map<int, void*>& srcBlockPointers)
{
	// \note Src layout is used as reference in case of activeUniforms happens to be incorrect in dstLayout blocks.
	int numBlocks = (int)srcLayout.blocks.size();

	for (int srcBlockNdx = 0; srcBlockNdx < numBlocks; srcBlockNdx++)
	{
		const BlockLayoutEntry&		srcBlock	= srcLayout.blocks[srcBlockNdx];
		const void*					srcBlockPtr	= srcBlockPointers.find(srcBlockNdx)->second;
		int							dstBlockNdx	= dstLayout.getBlockIndex(srcBlock.name.c_str());
		void*						dstBlockPtr	= dstBlockNdx >= 0 ? dstBlockPointers.find(dstBlockNdx)->second : DE_NULL;

		if (dstBlockNdx < 0)
			continue;

		for (vector<int>::const_iterator srcUniformNdxIter = srcBlock.activeUniformIndices.begin(); srcUniformNdxIter != srcBlock.activeUniformIndices.end(); srcUniformNdxIter++)
		{
			const UniformLayoutEntry&	srcEntry		= srcLayout.uniforms[*srcUniformNdxIter];
			int							dstUniformNdx	= dstLayout.getUniformIndex(srcEntry.name.c_str());

			if (dstUniformNdx < 0)
				continue;

			copyUniformData(dstLayout.uniforms[dstUniformNdx], dstBlockPtr, srcEntry, srcBlockPtr);
		}
	}
}